

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

long cmsys::SystemTools::ModifiedTime(string *filename)

{
  int iVar1;
  char *__file;
  undefined1 local_a8 [8];
  stat fs;
  long mt;
  string *filename_local;
  
  fs.__glibc_reserved[2] = 0;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat64(__file,(stat64 *)local_a8);
  if (iVar1 == 0) {
    fs.__glibc_reserved[2] = fs.st_atim.tv_nsec;
  }
  return fs.__glibc_reserved[2];
}

Assistant:

long int SystemTools::ModifiedTime(const std::string& filename)
{
  long int mt = 0;
#ifdef _WIN32
  WIN32_FILE_ATTRIBUTE_DATA fs;
  if (GetFileAttributesExW(Encoding::ToWindowsExtendedPath(filename).c_str(),
                           GetFileExInfoStandard, &fs) != 0) {
    mt = windows_filetime_to_posix_time(fs.ftLastWriteTime);
  }
#else
  struct stat fs;
  if (stat(filename.c_str(), &fs) == 0) {
    mt = static_cast<long int>(fs.st_mtime);
  }
#endif
  return mt;
}